

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

JavascriptRegExp *
Js::JavascriptRegExp::ToRegExp(Var var,PCWSTR varName,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined8 in_RAX;
  JavascriptRegExp *pJVar6;
  RecyclableObject *pRVar7;
  undefined4 *puVar8;
  undefined4 extraout_var;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  undefined8 uStack_38;
  TypeId remoteTypeId;
  
  uStack_38 = in_RAX;
  bVar3 = VarIs<Js::JavascriptRegExp>(var);
  if ((bVar3) &&
     (pJVar6 = UnsafeVarTo<Js::JavascriptRegExp>(var), pJVar6 != (JavascriptRegExp *)0x0)) {
    return pJVar6;
  }
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00d045a5;
    *puVar8 = 0;
LAB_00d04423:
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(var);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d045a5;
      *puVar8 = 0;
    }
    TVar1 = ((pRVar7->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        uStack_38 = CONCAT44(0x58,(undefined4)uStack_38);
        pRVar7 = UnsafeVarTo<Js::RecyclableObject>(var);
        iVar4 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x54])(pRVar7,(long)&uStack_38 + 4);
        if ((iVar4 != 0) && (uStack_38._4_4_ == 0x23)) {
          iVar4 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x56])(pRVar7);
          return (JavascriptRegExp *)CONCAT44(extraout_var,iVar4);
        }
      }
      goto LAB_00d04595;
    }
    BVar5 = RecyclableObject::IsExternal(pRVar7);
    if (BVar5 != 0) goto LAB_00d04595;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    error = "(typeId < TypeIds_Limit || obj->IsExternal())";
    message = "GetTypeId aValue has invalid TypeId";
    lineNumber = 0xe;
  }
  else {
    if (((ulong)var & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)var & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)var >> 0x32 != 0) || (((ulong)var & 0xffff000000000000) == 0x1000000000000))
      goto LAB_00d04595;
      goto LAB_00d04423;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar3) {
LAB_00d045a5:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar8 = 0;
LAB_00d04595:
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec38,varName);
}

Assistant:

JavascriptRegExp* JavascriptRegExp::ToRegExp(Var var, PCWSTR varName, ScriptContext* scriptContext)
    {
        JavascriptRegExp * regExp = JavascriptOperators::TryFromVar<JavascriptRegExp>(var);
        if (regExp)
        {
            return regExp;
        }

        if (JavascriptOperators::GetTypeId(var) == TypeIds_HostDispatch)
        {
            TypeId remoteTypeId = TypeIds_Limit;
            RecyclableObject* reclObj = UnsafeVarTo<RecyclableObject>(var);
            if (reclObj->GetRemoteTypeId(&remoteTypeId) && remoteTypeId == TypeIds_RegEx)
            {
                return static_cast<JavascriptRegExp *>(reclObj->GetRemoteObject());
            }
        }

        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedRegExp, varName);
    }